

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpretdfd.c
# Opt level: O0

uint32_t bit_ceil(uint32_t x)

{
  uint32_t i;
  uint32_t x_local;
  
  i = 0;
  while( true ) {
    if (0x1f < i) {
      return 0;
    }
    if (x - 1 < (uint)(1 << ((byte)i & 0x1f))) break;
    i = i + 1;
  }
  return 1 << ((byte)i & 0x1f);
}

Assistant:

static uint32_t bit_ceil(uint32_t x) {
    x -= 1;
    for (uint32_t i = 0; i < sizeof(x) * 8; ++i)
        if (1u << i > x)
            return 1u << i;
    return 0;
}